

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O2

uint __thiscall Js::ByteCodeWriter::DataChunk::RemainingBytes(DataChunk *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  uVar1 = this->byteSize;
  uVar4 = GetCurrentOffset(this);
  if (uVar1 < uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2a,"(byteSize >= GetCurrentOffset())",
                                "byteSize >= GetCurrentOffset()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar4 = this->byteSize;
  uVar5 = GetCurrentOffset(this);
  return uVar4 - uVar5;
}

Assistant:

inline uint RemainingBytes()
            {
                Assert(byteSize >= GetCurrentOffset());
                return byteSize - GetCurrentOffset();
            }